

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

SRCINFO * __thiscall Js::ScriptContext::GetModuleSrcInfo(ScriptContext *this,ModuleID moduleID)

{
  Type *addr;
  JavascriptLibrary *pJVar1;
  SourceContextInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  Recycler *pRVar6;
  undefined4 *puVar7;
  WriteBarrierPtr<const_SRCINFO> *pWVar8;
  SRCINFO *pSVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  uVar10 = (ulong)moduleID;
  if (this->moduleSrcInfoCount <= moduleID) {
    uVar11 = moduleID + 4;
    uVar10 = (ulong)uVar11;
    local_60 = (undefined1  [8])&Memory::WriteBarrierPtr<SRCINFO_const>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2d86450;
    data.filename._0_4_ = 0xc32;
    data.plusSize = uVar10;
    data._32_8_ = (ulong)moduleID;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    if (uVar11 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar6,(TrackAllocData *)0x0);
      pWVar8 = (WriteBarrierPtr<const_SRCINFO> *)&DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00797f13;
        *puVar7 = 0;
      }
      pWVar8 = (WriteBarrierPtr<const_SRCINFO> *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (pRVar6,uVar10 * 8);
      if (pWVar8 == (WriteBarrierPtr<const_SRCINFO> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_00797f13:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      memset(pWVar8,0,uVar10 * 8);
    }
    Memory::
    CopyArray<Memory::WriteBarrierPtr<SRCINFO_const>,Memory::WriteBarrierPtr<SRCINFO_const>,Memory::Recycler>
              (pWVar8,uVar10,
               (((this->super_ScriptContextBase).javascriptLibrary)->cache).moduleSrcInfo.ptr,
               (ulong)this->moduleSrcInfoCount);
    pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
    addr = &(pJVar1->cache).moduleSrcInfo;
    Memory::Recycler::WBSetBit((char *)addr);
    (pJVar1->cache).moduleSrcInfo.ptr = pWVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->moduleSrcInfoCount = uVar11;
    pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
    pSVar9 = (pJVar1->cache).noContextGlobalSourceInfo.ptr;
    pWVar8 = (pJVar1->cache).moduleSrcInfo.ptr;
    Memory::Recycler::WBSetBit((char *)pWVar8);
    pWVar8->ptr = pSVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar8);
    uVar10 = data._32_8_;
  }
  pSVar9 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).moduleSrcInfo.ptr
           [uVar10 & 0xffffffff].ptr;
  if (pSVar9 == (SRCINFO *)0x0) {
    local_60 = (undefined1  [8])&SRCINFO::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2d86450;
    data.filename._0_4_ = 0xc3c;
    pRVar6 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    pSVar9 = (SRCINFO *)new<Memory::Recycler>(0x28,pRVar6,0x572640);
    (pSVar9->sourceContextInfo).ptr = (SourceContextInfo *)0x0;
    pSVar2 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).noContextSourceContextInfo
             .ptr;
    Memory::Recycler::WBSetBit((char *)pSVar9);
    (pSVar9->sourceContextInfo).ptr = pSVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar9);
    pSVar9->moduleID = (Type)uVar10;
    pWVar8 = (((this->super_ScriptContextBase).javascriptLibrary)->cache).moduleSrcInfo.ptr +
             (uVar10 & 0xffffffff);
    Memory::Recycler::WBSetBit((char *)pWVar8);
    pWVar8->ptr = pSVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar8);
  }
  return pSVar9;
}

Assistant:

SRCINFO const *
        ScriptContext::GetModuleSrcInfo(Js::ModuleID moduleID)
    {
            if (moduleSrcInfoCount <= moduleID)
            {
                uint newCount = moduleID + 4;  // Preallocate 4 more slots, moduleID don't usually grow much

                Field(SRCINFO const *)* newModuleSrcInfo = RecyclerNewArrayZ(this->GetRecycler(), Field(SRCINFO const*), newCount);
                CopyArray(newModuleSrcInfo, newCount, Cache()->moduleSrcInfo, moduleSrcInfoCount);
                Cache()->moduleSrcInfo = newModuleSrcInfo;
                moduleSrcInfoCount = newCount;
                Cache()->moduleSrcInfo[0] = this->Cache()->noContextGlobalSourceInfo;
            }

            SRCINFO const * si = Cache()->moduleSrcInfo[moduleID];
            if (si == nullptr)
            {
                SRCINFO * newSrcInfo = RecyclerNewStructZ(this->GetRecycler(), SRCINFO);
                newSrcInfo->sourceContextInfo = this->Cache()->noContextSourceContextInfo;
                newSrcInfo->moduleID = moduleID;
                Cache()->moduleSrcInfo[moduleID] = newSrcInfo;
                si = newSrcInfo;
            }
            return si;
    }